

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.h
# Opt level: O2

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::InvocationInterlockPlacementPass
          (InvocationInterlockPlacementPass *this)

{
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__InvocationInterlockPlacementPass_00a700f0;
  (this->extracted_functions_)._M_h._M_buckets = &(this->extracted_functions_)._M_h._M_single_bucket
  ;
  (this->extracted_functions_)._M_h._M_bucket_count = 1;
  (this->extracted_functions_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extracted_functions_)._M_h._M_element_count = 0;
  (this->extracted_functions_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extracted_functions_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extracted_functions_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->begin_)._M_h._M_buckets = &(this->begin_)._M_h._M_single_bucket;
  (this->begin_)._M_h._M_bucket_count = 1;
  (this->begin_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->begin_)._M_h._M_element_count = 0;
  (this->begin_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->begin_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->begin_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->end_)._M_h._M_buckets = &(this->end_)._M_h._M_single_bucket;
  (this->end_)._M_h._M_bucket_count = 1;
  (this->end_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->end_)._M_h._M_element_count = 0;
  (this->end_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->end_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->end_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->after_begin_)._M_h._M_buckets = &(this->after_begin_)._M_h._M_single_bucket;
  (this->after_begin_)._M_h._M_bucket_count = 1;
  (this->after_begin_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->after_begin_)._M_h._M_element_count = 0;
  (this->after_begin_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->after_begin_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->after_begin_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->before_end_)._M_h._M_buckets = &(this->before_end_)._M_h._M_single_bucket;
  (this->before_end_)._M_h._M_bucket_count = 1;
  (this->before_end_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->before_end_)._M_h._M_element_count = 0;
  (this->before_end_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->before_end_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->before_end_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->predecessors_after_begin_)._M_h._M_buckets =
       &(this->predecessors_after_begin_)._M_h._M_single_bucket;
  (this->predecessors_after_begin_)._M_h._M_bucket_count = 1;
  (this->predecessors_after_begin_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->predecessors_after_begin_)._M_h._M_element_count = 0;
  (this->predecessors_after_begin_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->predecessors_after_begin_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->predecessors_after_begin_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->successors_before_end_)._M_h._M_buckets =
       &(this->successors_before_end_)._M_h._M_single_bucket;
  (this->successors_before_end_)._M_h._M_bucket_count = 1;
  (this->successors_before_end_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->successors_before_end_)._M_h._M_element_count = 0;
  (this->successors_before_end_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->successors_before_end_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->successors_before_end_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

InvocationInterlockPlacementPass() {}